

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall t_c_glib_generator::init_generator(t_c_glib_generator *this)

{
  t_program *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ostream *poVar5;
  vector<t_program_*,_std::allocator<t_program_*>_> *this_01;
  reference pptVar6;
  ulong uVar7;
  string *psVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  reference pbVar9;
  int __oflag;
  int __oflag_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_include;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *c_includes;
  string local_400;
  byte local_3da;
  byte local_3d9;
  string local_3d8;
  string local_3b8;
  byte local_392;
  allocator local_391;
  undefined1 local_390 [8];
  string include_nspace_prefix;
  string local_368;
  string local_348;
  string *local_328;
  string *include_nspace;
  t_program *include;
  const_iterator __end2;
  const_iterator __begin2;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range2;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string f_types_impl_name;
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string f_types_name;
  undefined1 local_148 [8];
  string program_name_lc;
  undefined1 local_108 [8];
  string program_name_uc;
  undefined1 local_c8 [8];
  string program_name_u;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_c_glib_generator *ptStack_10;
  int r;
  t_c_glib_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = mkdir(pcVar3,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar2;
  if ((iVar2 == -1) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
    program_name_u.field_2._M_local_buf[10] = '\x01';
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_98);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,pcVar3,(allocator *)(program_name_u.field_2._M_local_buf + 0xb));
    std::operator+(&local_58,&local_78,": ");
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    std::operator+(__return_storage_ptr__,&local_58,pcVar3);
    program_name_u.field_2._M_local_buf[10] = '\0';
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  std::__cxx11::string::string
            ((string *)(program_name_uc.field_2._M_local_buf + 8),
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  initial_caps_to_underscores
            ((string *)local_c8,(string *)(program_name_uc.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(program_name_uc.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(program_name_lc.field_2._M_local_buf + 8),(string *)local_c8);
  to_upper_case((string *)local_108,(string *)((long)&program_name_lc.field_2 + 8));
  std::__cxx11::string::~string((string *)(program_name_lc.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(f_types_name.field_2._M_local_buf + 8),(string *)local_c8)
  ;
  to_lower_case((string *)local_148,(string *)((long)&f_types_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(f_types_name.field_2._M_local_buf + 8));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_1e8);
  std::operator+(&local_1c8,&local_1e8,&this->nspace_lc);
  std::operator+(&local_1a8,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                 &local_1a8,"_types.h");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,pcVar3,(allocator *)(f_types_impl_name.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_,(char *)local_208,__oflag);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator
            ((allocator<char> *)(f_types_impl_name.field_2._M_local_buf + 0xf));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_290);
  std::operator+(&local_270,&local_290,&this->nspace_lc);
  std::operator+(&local_250,&local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                 &local_250,"_types.c");
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,pcVar3,&local_2b1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_impl_,(char *)local_2b0,__oflag_00);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_2d8);
  std::operator<<((ostream *)&this->f_types_,local_2d8);
  std::__cxx11::string::~string(local_2d8);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&includes);
  std::operator<<((ostream *)&this->f_types_impl_,(string *)&includes);
  std::__cxx11::string::~string((string *)&includes);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"#ifndef ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,(string *)local_108);
  poVar5 = std::operator<<(poVar5,"_TYPES_H");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,(string *)local_108);
  poVar5 = std::operator<<(poVar5,"_TYPES_H");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"/* base includes */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <glib-object.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/c_glib/thrift_struct.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/c_glib/protocol/thrift_protocol.h>");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  this_01 = t_program::get_includes((this->super_t_oop_generator).super_t_generator.program_);
  bVar1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::empty(this_01);
  if (!bVar1) {
    poVar5 = std::operator<<((ostream *)&this->f_types_,"/* other thrift includes */");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    __end2 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(this_01);
    include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                       *)&include), bVar1) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                ::operator*(&__end2);
      this_00 = *pptVar6;
      include_nspace = (string *)this_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_368,"c_glib",
                 (allocator *)(include_nspace_prefix.field_2._M_local_buf + 0xf));
      t_program::get_namespace(&local_348,this_00,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator
                ((allocator<char> *)(include_nspace_prefix.field_2._M_local_buf + 0xf));
      local_328 = &local_348;
      uVar7 = std::__cxx11::string::empty();
      local_392 = 0;
      local_3d9 = 0;
      local_3da = 0;
      if ((uVar7 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_3d8,(string *)local_328);
        local_3d9 = 1;
        initial_caps_to_underscores(&local_3b8,&local_3d8);
        local_3da = 1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_390,&local_3b8,"_");
      }
      else {
        std::allocator<char>::allocator();
        local_392 = 1;
        std::__cxx11::string::string((string *)local_390,"",&local_391);
      }
      if ((local_3da & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_3b8);
      }
      if ((local_3d9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_3d8);
      }
      if ((local_392 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
      }
      poVar5 = std::operator<<((ostream *)&this->f_types_,"#include \"");
      poVar5 = std::operator<<(poVar5,(string *)local_390);
      psVar8 = t_program::get_name_abi_cxx11_((t_program *)include_nspace);
      std::__cxx11::string::string((string *)&c_includes,(string *)psVar8);
      initial_caps_to_underscores(&local_400,(string *)&c_includes);
      poVar5 = std::operator<<(poVar5,(string *)&local_400);
      poVar5 = std::operator<<(poVar5,"_types.h\"");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&c_includes);
      std::__cxx11::string::~string((string *)local_390);
      std::__cxx11::string::~string((string *)&local_348);
      __gnu_cxx::
      __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  }
  this_02 = t_program::get_c_includes_abi_cxx11_
                      ((this->super_t_oop_generator).super_t_generator.program_);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"/* custom thrift includes */");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_02);
  c_include = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&c_include), bVar1) {
    pbVar9 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pbVar9);
    if (*pcVar3 == '<') {
      poVar5 = std::operator<<((ostream *)&this->f_types_,"#include ");
      poVar5 = std::operator<<(poVar5,(string *)pbVar9);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar5 = std::operator<<((ostream *)&this->f_types_,"#include \"");
      poVar5 = std::operator<<(poVar5,(string *)pbVar9);
      poVar5 = std::operator<<(poVar5,"\"");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_impl_,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <math.h>");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_impl_,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include \"");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_lc);
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_types.h\"");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/c_glib/thrift.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_types_,"/* begin types */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void t_c_glib_generator::init_generator() {
  /* create output directory */
  MKDIR(get_out_dir().c_str());

  string program_name_u = initial_caps_to_underscores(program_name_);
  string program_name_uc = to_upper_case(program_name_u);
  string program_name_lc = to_lower_case(program_name_u);

  /* create output files */
  string f_types_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.h";
  f_types_.open(f_types_name.c_str());
  string f_types_impl_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.c";
  f_types_impl_.open(f_types_impl_name.c_str());

  /* add thrift boilerplate headers */
  f_types_ << autogen_comment();
  f_types_impl_ << autogen_comment();

  /* include inclusion guard */
  f_types_ << "#ifndef " << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << "#define "
           << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << endl;

  /* include base types */
  f_types_ << "/* base includes */" << endl << "#include <glib-object.h>" << endl
           << "#include <thrift/c_glib/thrift_struct.h>" << endl
           << "#include <thrift/c_glib/protocol/thrift_protocol.h>" << endl;

  /* include other thrift includes */
  const vector<t_program*>& includes = program_->get_includes();
  if (!includes.empty()) {
    f_types_ << "/* other thrift includes */" << endl;

    for (auto include : includes) {
      const std::string& include_nspace = include->get_namespace("c_glib");
      std::string include_nspace_prefix =
        include_nspace.empty() ? "" : initial_caps_to_underscores(include_nspace) + "_";

      f_types_ << "#include \"" << include_nspace_prefix
               << initial_caps_to_underscores(include->get_name()) << "_types.h\"" << endl;
    }
    f_types_ << endl;
  }

  /* include custom headers */
  const vector<string>& c_includes = program_->get_c_includes();
  f_types_ << "/* custom thrift includes */" << endl;
  for (const auto & c_include : c_includes) {
    if (c_include[0] == '<') {
      f_types_ << "#include " << c_include << endl;
    } else {
      f_types_ << "#include \"" << c_include << "\"" << endl;
    }
  }
  f_types_ << endl;

  /* include math.h (for "INFINITY") in the implementation file, in case we
     encounter a struct with a member of type double */
  f_types_impl_ << endl << "#include <math.h>" << endl;

  // include the types file
  f_types_impl_ << endl << "#include \"" << this->nspace_lc << program_name_u << "_types.h\""
                << endl << "#include <thrift/c_glib/thrift.h>" << endl << endl;

  f_types_ << "/* begin types */" << endl << endl;
}